

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

string * __thiscall jwt::header::get_algorithm_abi_cxx11_(header *this)

{
  claim *this_00;
  string *psVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"alg","");
  this_00 = get_header_claim(this,&local_38);
  psVar1 = claim::as_string_abi_cxx11_(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return psVar1;
}

Assistant:

const std::string& get_algorithm() const { return get_header_claim("alg").as_string(); }